

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<4,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  Scene *pSVar9;
  float **ppfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined8 uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  RTCIntersectArguments *pRVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined4 uVar64;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar66 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_b6c;
  ulong local_b68;
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  RTCIntersectArguments *local_b08;
  Geometry *local_b00;
  ulong local_af8;
  ulong local_af0;
  ulong local_ae8;
  ulong *local_ae0;
  RayQueryContext *local_ad8;
  long local_ad0;
  long local_ac8;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  undefined4 local_aac;
  uint local_aa8;
  uint local_aa4;
  uint local_aa0;
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  byte local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820;
  ulong local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar32 [16];
  undefined1 auVar65 [64];
  
  local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800 != 8) {
    fVar67 = ray->tfar;
    if (0.0 <= fVar67) {
      aVar8 = (ray->dir).field_0;
      auVar36 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar30._8_4_ = 0x7fffffff;
      auVar30._0_8_ = 0x7fffffff7fffffff;
      auVar30._12_4_ = 0x7fffffff;
      auVar30 = vandps_avx512vl((undefined1  [16])aVar8,auVar30);
      auVar31._8_4_ = 0x219392ef;
      auVar31._0_8_ = 0x219392ef219392ef;
      auVar31._12_4_ = 0x219392ef;
      uVar24 = vcmpps_avx512vl(auVar30,auVar31,1);
      local_ae0 = local_7f8;
      auVar33._8_4_ = 0x3f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      auVar33._12_4_ = 0x3f800000;
      auVar30 = vdivps_avx(auVar33,(undefined1  [16])aVar8);
      auVar31 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar29 = (bool)((byte)uVar24 & 1);
      auVar32._0_4_ = (uint)bVar29 * auVar31._0_4_ | (uint)!bVar29 * auVar30._0_4_;
      bVar29 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar32._4_4_ = (uint)bVar29 * auVar31._4_4_ | (uint)!bVar29 * auVar30._4_4_;
      bVar29 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar32._8_4_ = (uint)bVar29 * auVar31._8_4_ | (uint)!bVar29 * auVar30._8_4_;
      bVar29 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar32._12_4_ = (uint)bVar29 * auVar31._12_4_ | (uint)!bVar29 * auVar30._12_4_;
      auVar35._8_4_ = 0x3f7ffffa;
      auVar35._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar35._12_4_ = 0x3f7ffffa;
      auVar33 = vmulps_avx512vl(auVar32,auVar35);
      auVar34._8_4_ = 0x3f800003;
      auVar34._0_8_ = 0x3f8000033f800003;
      auVar34._12_4_ = 0x3f800003;
      auVar34 = vmulps_avx512vl(auVar32,auVar34);
      auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar78 = ZEXT1664(auVar30);
      auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar79 = ZEXT1664(auVar30);
      auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar80 = ZEXT1664(auVar30);
      auVar30 = vbroadcastss_avx512vl(auVar33);
      auVar81 = ZEXT1664(auVar30);
      auVar30 = vmovshdup_avx(auVar33);
      auVar31 = vshufps_avx512vl(auVar33,auVar33,0x55);
      auVar82 = ZEXT1664(auVar31);
      auVar31 = vshufpd_avx(auVar33,auVar33,1);
      auVar35 = vshufps_avx512vl(auVar33,auVar33,0xaa);
      auVar83 = ZEXT1664(auVar35);
      fVar61 = auVar34._0_4_;
      auVar35 = vshufps_avx(auVar34,auVar34,0x55);
      auVar74 = ZEXT1664(auVar35);
      auVar35 = vshufps_avx(auVar34,auVar34,0xaa);
      auVar75 = ZEXT1664(auVar35);
      local_ae8 = (ulong)(auVar33._0_4_ < 0.0) << 4;
      local_af0 = (ulong)(auVar30._0_4_ < 0.0) << 4 | 0x20;
      uVar24 = (ulong)(auVar31._0_4_ < 0.0) << 4 | 0x40;
      uVar27 = local_ae8 ^ 0x10;
      uVar28 = local_af0 ^ 0x10;
      uVar64 = auVar36._0_4_;
      auVar65 = ZEXT1664(CONCAT412(uVar64,CONCAT48(uVar64,CONCAT44(uVar64,uVar64))));
      auVar71 = ZEXT1664(CONCAT412(fVar67,CONCAT48(fVar67,CONCAT44(fVar67,fVar67))));
      local_ad8 = context;
      fVar67 = fVar61;
      fVar68 = fVar61;
      fVar69 = fVar61;
      do {
        uVar26 = local_ae0[-1];
        local_ae0 = local_ae0 + -1;
        while ((uVar26 & 8) == 0) {
          auVar30 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + local_ae8),auVar78._0_16_
                                   );
          auVar30 = vmulps_avx512vl(auVar81._0_16_,auVar30);
          auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + local_af0),auVar79._0_16_
                                   );
          auVar36 = vmulps_avx512vl(auVar82._0_16_,auVar36);
          auVar30 = vmaxps_avx(auVar30,auVar36);
          auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar24),auVar80._0_16_);
          auVar36 = vmulps_avx512vl(auVar83._0_16_,auVar36);
          auVar36 = vmaxps_avx(auVar36,auVar65._0_16_);
          auVar30 = vmaxps_avx(auVar30,auVar36);
          auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar27),auVar78._0_16_);
          auVar60._0_4_ = fVar61 * auVar36._0_4_;
          auVar60._4_4_ = fVar67 * auVar36._4_4_;
          auVar60._8_4_ = fVar68 * auVar36._8_4_;
          auVar60._12_4_ = fVar69 * auVar36._12_4_;
          auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + uVar28),auVar79._0_16_);
          auVar62._0_4_ = auVar74._0_4_ * auVar36._0_4_;
          auVar62._4_4_ = auVar74._4_4_ * auVar36._4_4_;
          auVar62._8_4_ = auVar74._8_4_ * auVar36._8_4_;
          auVar62._12_4_ = auVar74._12_4_ * auVar36._12_4_;
          auVar36 = vminps_avx(auVar60,auVar62);
          auVar31 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + (uVar24 ^ 0x10)),
                                    auVar80._0_16_);
          auVar63._0_4_ = auVar75._0_4_ * auVar31._0_4_;
          auVar63._4_4_ = auVar75._4_4_ * auVar31._4_4_;
          auVar63._8_4_ = auVar75._8_4_ * auVar31._8_4_;
          auVar63._12_4_ = auVar75._12_4_ * auVar31._12_4_;
          auVar31 = vminps_avx(auVar63,auVar71._0_16_);
          auVar36 = vminps_avx(auVar36,auVar31);
          uVar22 = vcmpps_avx512vl(auVar30,auVar36,2);
          if ((char)uVar22 == '\0') goto LAB_00684fe1;
          uVar19 = uVar26 & 0xfffffffffffffff0;
          lVar23 = 0;
          for (uVar26 = uVar22; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
            lVar23 = lVar23 + 1;
          }
          uVar26 = *(ulong *)(uVar19 + lVar23 * 8);
          uVar21 = (uint)uVar22 - 1 & (uint)uVar22;
          uVar22 = (ulong)uVar21;
          if (uVar21 != 0) {
            *local_ae0 = uVar26;
            lVar23 = 0;
            for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              lVar23 = lVar23 + 1;
            }
            uVar21 = uVar21 - 1 & uVar21;
            uVar22 = (ulong)uVar21;
            bVar29 = uVar21 == 0;
            while( true ) {
              local_ae0 = local_ae0 + 1;
              uVar26 = *(ulong *)(uVar19 + lVar23 * 8);
              if (bVar29) break;
              *local_ae0 = uVar26;
              lVar23 = 0;
              for (uVar26 = uVar22; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                lVar23 = lVar23 + 1;
              }
              uVar22 = uVar22 - 1 & uVar22;
              bVar29 = uVar22 == 0;
            }
          }
        }
        local_ad0 = (ulong)((uint)uVar26 & 0xf) - 8;
        if (local_ad0 != 0) {
          uVar26 = uVar26 & 0xfffffffffffffff0;
          pSVar9 = local_ad8->scene;
          local_ac8 = 0;
          local_b20 = fVar61;
          fStack_b1c = fVar67;
          fStack_b18 = fVar68;
          fStack_b14 = fVar69;
          local_b30 = auVar74._0_16_;
          local_b40 = auVar75._0_16_;
          local_b50 = auVar65._0_16_;
          local_b60 = auVar71._0_16_;
          do {
            lVar20 = local_ac8 * 0x60;
            ppfVar10 = (pSVar9->vertices).items;
            pfVar11 = ppfVar10[*(uint *)(uVar26 + 0x48 + lVar20)];
            auVar38._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar26 + 0x28 + lVar20));
            auVar38._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar26 + 8 + lVar20));
            pfVar12 = ppfVar10[*(uint *)(uVar26 + 0x40 + lVar20)];
            auVar39._16_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar26 + 0x20 + lVar20));
            auVar39._0_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar26 + lVar20));
            pfVar13 = ppfVar10[*(uint *)(uVar26 + 0x4c + lVar20)];
            auVar40._16_16_ = *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar26 + 0x2c + lVar20));
            auVar40._0_16_ = *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar26 + 0xc + lVar20));
            pfVar14 = ppfVar10[*(uint *)(uVar26 + 0x44 + lVar20)];
            auVar44._16_16_ = *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar26 + 0x24 + lVar20));
            auVar44._0_16_ = *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar26 + 4 + lVar20));
            lVar23 = uVar26 + 0x40 + lVar20;
            local_9e0 = *(undefined8 *)(lVar23 + 0x10);
            uStack_9d8 = *(undefined8 *)(lVar23 + 0x18);
            uStack_9d0 = local_9e0;
            uStack_9c8 = uStack_9d8;
            lVar23 = uVar26 + 0x50 + lVar20;
            local_a00 = *(undefined8 *)(lVar23 + 0x10);
            uStack_9f8 = *(undefined8 *)(lVar23 + 0x18);
            auVar31 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar12 + *(uint *)(uVar26 + 0x10 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar26 + 0x18 + lVar20)));
            auVar30 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar12 + *(uint *)(uVar26 + 0x10 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar26 + 0x18 + lVar20)));
            auVar35 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar14 + *(uint *)(uVar26 + 0x14 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar13 + *(uint *)(uVar26 + 0x1c + lVar20)));
            auVar36 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar14 + *(uint *)(uVar26 + 0x14 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar13 + *(uint *)(uVar26 + 0x1c + lVar20)));
            auVar34 = vunpcklps_avx(auVar30,auVar36);
            auVar32 = vunpcklps_avx(auVar31,auVar35);
            auVar30 = vunpckhps_avx(auVar31,auVar35);
            auVar35 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar12 + *(uint *)(uVar26 + 0x30 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar26 + 0x38 + lVar20)));
            auVar36 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar12 + *(uint *)(uVar26 + 0x30 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar26 + 0x38 + lVar20)));
            auVar33 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar14 + *(uint *)(uVar26 + 0x34 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar13 + *(uint *)(uVar26 + 0x3c + lVar20)));
            auVar31 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar14 + *(uint *)(uVar26 + 0x34 + lVar20)),
                                    *(undefined1 (*) [16])
                                     (pfVar13 + *(uint *)(uVar26 + 0x3c + lVar20)));
            auVar31 = vunpcklps_avx(auVar36,auVar31);
            auVar60 = vunpcklps_avx(auVar35,auVar33);
            auVar36 = vunpckhps_avx(auVar35,auVar33);
            uStack_9f0 = local_a00;
            uStack_9e8 = uStack_9f8;
            auVar59 = vunpcklps_avx(auVar44,auVar40);
            auVar58 = vunpcklps_avx(auVar39,auVar38);
            auVar54 = vunpcklps_avx(auVar58,auVar59);
            auVar58 = vunpckhps_avx(auVar58,auVar59);
            auVar59 = vunpckhps_avx(auVar44,auVar40);
            auVar41 = vunpckhps_avx(auVar39,auVar38);
            auVar41 = vunpcklps_avx(auVar41,auVar59);
            auVar42._16_16_ = auVar32;
            auVar42._0_16_ = auVar32;
            auVar45._16_16_ = auVar30;
            auVar45._0_16_ = auVar30;
            auVar43._16_16_ = auVar34;
            auVar43._0_16_ = auVar34;
            auVar47._16_16_ = auVar60;
            auVar47._0_16_ = auVar60;
            auVar48._16_16_ = auVar36;
            auVar48._0_16_ = auVar36;
            uVar64 = *(undefined4 *)&(ray->org).field_0;
            auVar49._4_4_ = uVar64;
            auVar49._0_4_ = uVar64;
            auVar49._8_4_ = uVar64;
            auVar49._12_4_ = uVar64;
            auVar49._16_4_ = uVar64;
            auVar49._20_4_ = uVar64;
            auVar49._24_4_ = uVar64;
            auVar49._28_4_ = uVar64;
            auVar37 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
            auVar38 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
            uVar64 = *(undefined4 *)&(ray->dir).field_0;
            auVar70._4_4_ = uVar64;
            auVar70._0_4_ = uVar64;
            auVar70._8_4_ = uVar64;
            auVar70._12_4_ = uVar64;
            auVar70._16_4_ = uVar64;
            auVar70._20_4_ = uVar64;
            auVar70._24_4_ = uVar64;
            auVar70._28_4_ = uVar64;
            auVar46._16_16_ = auVar31;
            auVar46._0_16_ = auVar31;
            uVar64 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
            auVar73._4_4_ = uVar64;
            auVar73._0_4_ = uVar64;
            auVar73._8_4_ = uVar64;
            auVar73._12_4_ = uVar64;
            auVar73._16_4_ = uVar64;
            auVar73._20_4_ = uVar64;
            auVar73._24_4_ = uVar64;
            auVar73._28_4_ = uVar64;
            fVar7 = (ray->dir).field_0.m128[2];
            auVar76._4_4_ = fVar7;
            auVar76._0_4_ = fVar7;
            auVar76._8_4_ = fVar7;
            auVar76._12_4_ = fVar7;
            auVar76._16_4_ = fVar7;
            auVar76._20_4_ = fVar7;
            auVar76._24_4_ = fVar7;
            auVar76._28_4_ = fVar7;
            auVar59 = vsubps_avx(auVar54,auVar49);
            auVar39 = vsubps_avx512vl(auVar58,auVar37);
            auVar40 = vsubps_avx512vl(auVar41,auVar38);
            auVar41 = vsubps_avx512vl(auVar42,auVar49);
            auVar42 = vsubps_avx512vl(auVar45,auVar37);
            auVar43 = vsubps_avx512vl(auVar43,auVar38);
            auVar44 = vsubps_avx512vl(auVar47,auVar49);
            auVar45 = vsubps_avx512vl(auVar48,auVar37);
            auVar38 = vsubps_avx512vl(auVar46,auVar38);
            auVar46 = vsubps_avx512vl(auVar44,auVar59);
            auVar58 = vsubps_avx(auVar45,auVar39);
            auVar47 = vsubps_avx512vl(auVar38,auVar40);
            auVar48 = vsubps_avx512vl(auVar59,auVar41);
            auVar49 = vsubps_avx512vl(auVar39,auVar42);
            auVar50 = vsubps_avx512vl(auVar40,auVar43);
            auVar51 = vsubps_avx512vl(auVar41,auVar44);
            auVar52 = vsubps_avx512vl(auVar42,auVar45);
            auVar53 = vsubps_avx512vl(auVar43,auVar38);
            auVar37 = vaddps_avx512vl(auVar44,auVar59);
            auVar77._0_4_ = auVar45._0_4_ + auVar39._0_4_;
            auVar77._4_4_ = auVar45._4_4_ + auVar39._4_4_;
            auVar77._8_4_ = auVar45._8_4_ + auVar39._8_4_;
            auVar77._12_4_ = auVar45._12_4_ + auVar39._12_4_;
            auVar77._16_4_ = auVar45._16_4_ + auVar39._16_4_;
            auVar77._20_4_ = auVar45._20_4_ + auVar39._20_4_;
            auVar77._24_4_ = auVar45._24_4_ + auVar39._24_4_;
            auVar77._28_4_ = auVar45._28_4_ + auVar39._28_4_;
            auVar54 = vaddps_avx512vl(auVar38,auVar40);
            auVar55 = vmulps_avx512vl(auVar77,auVar47);
            auVar55 = vfmsub231ps_avx512vl(auVar55,auVar58,auVar54);
            auVar54 = vmulps_avx512vl(auVar54,auVar46);
            auVar56 = vfmsub231ps_avx512vl(auVar54,auVar47,auVar37);
            auVar54._4_4_ = auVar58._4_4_ * auVar37._4_4_;
            auVar54._0_4_ = auVar58._0_4_ * auVar37._0_4_;
            auVar54._8_4_ = auVar58._8_4_ * auVar37._8_4_;
            auVar54._12_4_ = auVar58._12_4_ * auVar37._12_4_;
            auVar54._16_4_ = auVar58._16_4_ * auVar37._16_4_;
            auVar54._20_4_ = auVar58._20_4_ * auVar37._20_4_;
            auVar54._24_4_ = auVar58._24_4_ * auVar37._24_4_;
            auVar54._28_4_ = auVar37._28_4_;
            auVar30 = vfmsub231ps_fma(auVar54,auVar46,auVar77);
            auVar57._0_4_ = fVar7 * auVar30._0_4_;
            auVar57._4_4_ = fVar7 * auVar30._4_4_;
            auVar57._8_4_ = fVar7 * auVar30._8_4_;
            auVar57._12_4_ = fVar7 * auVar30._12_4_;
            auVar57._16_4_ = fVar7 * 0.0;
            auVar57._20_4_ = fVar7 * 0.0;
            auVar57._24_4_ = fVar7 * 0.0;
            auVar57._28_4_ = 0;
            auVar54 = vfmadd231ps_avx512vl(auVar57,auVar73,auVar56);
            local_9c0 = vfmadd231ps_avx512vl(auVar54,auVar70,auVar55);
            auVar54 = vaddps_avx512vl(auVar59,auVar41);
            auVar37 = vaddps_avx512vl(auVar39,auVar42);
            auVar55 = vaddps_avx512vl(auVar40,auVar43);
            auVar56 = vmulps_avx512vl(auVar37,auVar50);
            auVar56 = vfmsub231ps_avx512vl(auVar56,auVar49,auVar55);
            auVar55 = vmulps_avx512vl(auVar55,auVar48);
            auVar55 = vfmsub231ps_avx512vl(auVar55,auVar50,auVar54);
            auVar54 = vmulps_avx512vl(auVar54,auVar49);
            auVar54 = vfmsub231ps_avx512vl(auVar54,auVar48,auVar37);
            auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar37._4_4_ = fVar7 * auVar54._4_4_;
            auVar37._0_4_ = fVar7 * auVar54._0_4_;
            auVar37._8_4_ = fVar7 * auVar54._8_4_;
            auVar37._12_4_ = fVar7 * auVar54._12_4_;
            auVar37._16_4_ = fVar7 * auVar54._16_4_;
            auVar37._20_4_ = fVar7 * auVar54._20_4_;
            auVar37._24_4_ = fVar7 * auVar54._24_4_;
            auVar37._28_4_ = auVar54._28_4_;
            auVar54 = vfmadd231ps_avx512vl(auVar37,auVar73,auVar55);
            local_9a0 = vfmadd231ps_avx512vl(auVar54,auVar70,auVar56);
            auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar41 = vaddps_avx512vl(auVar41,auVar44);
            auVar37 = vaddps_avx512vl(auVar42,auVar45);
            auVar38 = vaddps_avx512vl(auVar43,auVar38);
            auVar42 = vmulps_avx512vl(auVar37,auVar53);
            auVar42 = vfmsub231ps_avx512vl(auVar42,auVar52,auVar38);
            auVar38 = vmulps_avx512vl(auVar38,auVar51);
            auVar38 = vfmsub231ps_avx512vl(auVar38,auVar53,auVar41);
            auVar41 = vmulps_avx512vl(auVar41,auVar52);
            auVar41 = vfmsub231ps_avx512vl(auVar41,auVar51,auVar37);
            auVar41 = vmulps_avx512vl(auVar76,auVar41);
            auVar41 = vfmadd231ps_avx512vl(auVar41,auVar73,auVar38);
            auVar37 = vfmadd231ps_avx512vl(auVar41,auVar70,auVar42);
            auVar55._0_4_ = local_9a0._0_4_ + local_9c0._0_4_;
            auVar55._4_4_ = local_9a0._4_4_ + local_9c0._4_4_;
            auVar55._8_4_ = local_9a0._8_4_ + local_9c0._8_4_;
            auVar55._12_4_ = local_9a0._12_4_ + local_9c0._12_4_;
            auVar55._16_4_ = local_9a0._16_4_ + local_9c0._16_4_;
            auVar55._20_4_ = local_9a0._20_4_ + local_9c0._20_4_;
            auVar55._24_4_ = local_9a0._24_4_ + local_9c0._24_4_;
            auVar55._28_4_ = local_9a0._28_4_ + local_9c0._28_4_;
            local_980 = vaddps_avx512vl(auVar37,auVar55);
            vandps_avx512vl(local_980,auVar54);
            auVar41._8_4_ = 0x34000000;
            auVar41._0_8_ = 0x3400000034000000;
            auVar41._12_4_ = 0x34000000;
            auVar41._16_4_ = 0x34000000;
            auVar41._20_4_ = 0x34000000;
            auVar41._24_4_ = 0x34000000;
            auVar41._28_4_ = 0x34000000;
            auVar41 = vmulps_avx512vl(local_980,auVar41);
            auVar38 = vminps_avx512vl(local_9c0,local_9a0);
            auVar38 = vminps_avx512vl(auVar38,auVar37);
            auVar42 = vxorps_avx512vl(auVar41,auVar57);
            uVar15 = vcmpps_avx512vl(auVar38,auVar42,5);
            auVar38 = vmaxps_avx512vl(local_9c0,local_9a0);
            auVar37 = vmaxps_avx512vl(auVar38,auVar37);
            uVar16 = vcmpps_avx512vl(auVar37,auVar41,2);
            local_900 = (byte)uVar15 | (byte)uVar16;
            fVar67 = fStack_b1c;
            fVar68 = fStack_b18;
            fVar69 = fStack_b14;
            fVar61 = local_b20;
            if (local_900 == 0) {
LAB_00684f9f:
              auVar74 = ZEXT1664(local_b30);
              auVar75 = ZEXT1664(local_b40);
              auVar65 = ZEXT1664(local_b50);
              auVar71 = ZEXT1664(local_b60);
            }
            else {
              auVar41 = vmulps_avx512vl(auVar47,auVar49);
              auVar37 = vmulps_avx512vl(auVar46,auVar50);
              auVar38 = vmulps_avx512vl(auVar58,auVar48);
              auVar42 = vmulps_avx512vl(auVar50,auVar52);
              auVar43 = vmulps_avx512vl(auVar48,auVar53);
              auVar44 = vmulps_avx512vl(auVar49,auVar51);
              auVar58 = vfmsub213ps_avx512vl(auVar58,auVar50,auVar41);
              auVar45 = vfmsub213ps_avx512vl(auVar47,auVar48,auVar37);
              auVar46 = vfmsub213ps_avx512vl(auVar46,auVar49,auVar38);
              auVar47 = vfmsub213ps_avx512vl(auVar53,auVar49,auVar42);
              auVar49 = vfmsub213ps_avx512vl(auVar51,auVar50,auVar43);
              auVar48 = vfmsub213ps_avx512vl(auVar52,auVar48,auVar44);
              vandps_avx512vl(auVar41,auVar54);
              vandps_avx512vl(auVar42,auVar54);
              uVar22 = vcmpps_avx512vl(auVar48,auVar48,1);
              vandps_avx512vl(auVar37,auVar54);
              vandps_avx512vl(auVar43,auVar54);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              uVar19 = vcmpps_avx512vl(auVar48,auVar48,1);
              vandps_avx512vl(auVar38,auVar54);
              vandps_avx512vl(auVar44,auVar54);
              uVar17 = vcmpps_avx512vl(auVar41,auVar41,1);
              bVar29 = (bool)((byte)uVar22 & 1);
              local_960._0_4_ =
                   (float)((uint)bVar29 * auVar58._0_4_ | (uint)!bVar29 * auVar47._0_4_);
              bVar29 = (bool)((byte)(uVar22 >> 1) & 1);
              local_960._4_4_ =
                   (float)((uint)bVar29 * auVar58._4_4_ | (uint)!bVar29 * auVar47._4_4_);
              bVar29 = (bool)((byte)(uVar22 >> 2) & 1);
              local_960._8_4_ =
                   (float)((uint)bVar29 * auVar58._8_4_ | (uint)!bVar29 * auVar47._8_4_);
              bVar29 = (bool)((byte)(uVar22 >> 3) & 1);
              local_960._12_4_ =
                   (float)((uint)bVar29 * auVar58._12_4_ | (uint)!bVar29 * auVar47._12_4_);
              bVar29 = (bool)((byte)(uVar22 >> 4) & 1);
              local_960._16_4_ =
                   (float)((uint)bVar29 * auVar58._16_4_ | (uint)!bVar29 * auVar47._16_4_);
              bVar29 = (bool)((byte)(uVar22 >> 5) & 1);
              local_960._20_4_ =
                   (float)((uint)bVar29 * auVar58._20_4_ | (uint)!bVar29 * auVar47._20_4_);
              bVar29 = (bool)((byte)(uVar22 >> 6) & 1);
              local_960._24_4_ =
                   (float)((uint)bVar29 * auVar58._24_4_ | (uint)!bVar29 * auVar47._24_4_);
              bVar29 = SUB81(uVar22 >> 7,0);
              local_960._28_4_ = (uint)bVar29 * auVar58._28_4_ | (uint)!bVar29 * auVar47._28_4_;
              bVar29 = (bool)((byte)uVar19 & 1);
              local_940._0_4_ =
                   (float)((uint)bVar29 * auVar45._0_4_ | (uint)!bVar29 * auVar49._0_4_);
              bVar29 = (bool)((byte)(uVar19 >> 1) & 1);
              local_940._4_4_ =
                   (float)((uint)bVar29 * auVar45._4_4_ | (uint)!bVar29 * auVar49._4_4_);
              bVar29 = (bool)((byte)(uVar19 >> 2) & 1);
              local_940._8_4_ =
                   (float)((uint)bVar29 * auVar45._8_4_ | (uint)!bVar29 * auVar49._8_4_);
              bVar29 = (bool)((byte)(uVar19 >> 3) & 1);
              local_940._12_4_ =
                   (float)((uint)bVar29 * auVar45._12_4_ | (uint)!bVar29 * auVar49._12_4_);
              bVar29 = (bool)((byte)(uVar19 >> 4) & 1);
              local_940._16_4_ =
                   (float)((uint)bVar29 * auVar45._16_4_ | (uint)!bVar29 * auVar49._16_4_);
              bVar29 = (bool)((byte)(uVar19 >> 5) & 1);
              local_940._20_4_ =
                   (float)((uint)bVar29 * auVar45._20_4_ | (uint)!bVar29 * auVar49._20_4_);
              bVar29 = (bool)((byte)(uVar19 >> 6) & 1);
              local_940._24_4_ =
                   (float)((uint)bVar29 * auVar45._24_4_ | (uint)!bVar29 * auVar49._24_4_);
              bVar29 = SUB81(uVar19 >> 7,0);
              local_940._28_4_ = (uint)bVar29 * auVar45._28_4_ | (uint)!bVar29 * auVar49._28_4_;
              bVar29 = (bool)((byte)uVar17 & 1);
              local_920._0_4_ =
                   (float)((uint)bVar29 * auVar46._0_4_ | (uint)!bVar29 * auVar48._0_4_);
              bVar29 = (bool)((byte)(uVar17 >> 1) & 1);
              local_920._4_4_ =
                   (float)((uint)bVar29 * auVar46._4_4_ | (uint)!bVar29 * auVar48._4_4_);
              bVar29 = (bool)((byte)(uVar17 >> 2) & 1);
              local_920._8_4_ =
                   (float)((uint)bVar29 * auVar46._8_4_ | (uint)!bVar29 * auVar48._8_4_);
              bVar29 = (bool)((byte)(uVar17 >> 3) & 1);
              local_920._12_4_ =
                   (float)((uint)bVar29 * auVar46._12_4_ | (uint)!bVar29 * auVar48._12_4_);
              bVar29 = (bool)((byte)(uVar17 >> 4) & 1);
              local_920._16_4_ =
                   (float)((uint)bVar29 * auVar46._16_4_ | (uint)!bVar29 * auVar48._16_4_);
              bVar29 = (bool)((byte)(uVar17 >> 5) & 1);
              local_920._20_4_ =
                   (float)((uint)bVar29 * auVar46._20_4_ | (uint)!bVar29 * auVar48._20_4_);
              bVar29 = (bool)((byte)(uVar17 >> 6) & 1);
              local_920._24_4_ =
                   (float)((uint)bVar29 * auVar46._24_4_ | (uint)!bVar29 * auVar48._24_4_);
              bVar29 = SUB81(uVar17 >> 7,0);
              local_920._28_4_ = (uint)bVar29 * auVar46._28_4_ | (uint)!bVar29 * auVar48._28_4_;
              auVar51._4_4_ = fVar7 * local_920._4_4_;
              auVar51._0_4_ = fVar7 * local_920._0_4_;
              auVar51._8_4_ = fVar7 * local_920._8_4_;
              auVar51._12_4_ = fVar7 * local_920._12_4_;
              auVar51._16_4_ = fVar7 * local_920._16_4_;
              auVar51._20_4_ = fVar7 * local_920._20_4_;
              auVar51._24_4_ = fVar7 * local_920._24_4_;
              auVar51._28_4_ = fVar7;
              auVar30 = vfmadd213ps_fma(auVar73,local_940,auVar51);
              auVar30 = vfmadd213ps_fma(auVar70,local_960,ZEXT1632(auVar30));
              auVar54 = ZEXT1632(CONCAT412(auVar30._12_4_ + auVar30._12_4_,
                                           CONCAT48(auVar30._8_4_ + auVar30._8_4_,
                                                    CONCAT44(auVar30._4_4_ + auVar30._4_4_,
                                                             auVar30._0_4_ + auVar30._0_4_))));
              auVar52._0_4_ = auVar40._0_4_ * local_920._0_4_;
              auVar52._4_4_ = auVar40._4_4_ * local_920._4_4_;
              auVar52._8_4_ = auVar40._8_4_ * local_920._8_4_;
              auVar52._12_4_ = auVar40._12_4_ * local_920._12_4_;
              auVar52._16_4_ = auVar40._16_4_ * local_920._16_4_;
              auVar52._20_4_ = auVar40._20_4_ * local_920._20_4_;
              auVar52._24_4_ = auVar40._24_4_ * local_920._24_4_;
              auVar52._28_4_ = 0;
              auVar30 = vfmadd213ps_fma(auVar39,local_940,auVar52);
              auVar36 = vfmadd213ps_fma(auVar59,local_960,ZEXT1632(auVar30));
              auVar58 = vrcp14ps_avx512vl(auVar54);
              auVar59._8_4_ = 0x3f800000;
              auVar59._0_8_ = 0x3f8000003f800000;
              auVar59._12_4_ = 0x3f800000;
              auVar59._16_4_ = 0x3f800000;
              auVar59._20_4_ = 0x3f800000;
              auVar59._24_4_ = 0x3f800000;
              auVar59._28_4_ = 0x3f800000;
              auVar59 = vfnmadd213ps_avx512vl(auVar58,auVar54,auVar59);
              auVar30 = vfmadd132ps_fma(auVar59,auVar58,auVar58);
              local_8a0 = ZEXT1632(CONCAT412((auVar36._12_4_ + auVar36._12_4_) * auVar30._12_4_,
                                             CONCAT48((auVar36._8_4_ + auVar36._8_4_) *
                                                      auVar30._8_4_,
                                                      CONCAT44((auVar36._4_4_ + auVar36._4_4_) *
                                                               auVar30._4_4_,
                                                               (auVar36._0_4_ + auVar36._0_4_) *
                                                               auVar30._0_4_))));
              uVar64 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar58._4_4_ = uVar64;
              auVar58._0_4_ = uVar64;
              auVar58._8_4_ = uVar64;
              auVar58._12_4_ = uVar64;
              auVar58._16_4_ = uVar64;
              auVar58._20_4_ = uVar64;
              auVar58._24_4_ = uVar64;
              auVar58._28_4_ = uVar64;
              uVar15 = vcmpps_avx512vl(local_8a0,auVar58,0xd);
              auVar59 = vxorps_avx512vl(auVar54,auVar41);
              fVar7 = ray->tfar;
              auVar50._4_4_ = fVar7;
              auVar50._0_4_ = fVar7;
              auVar50._8_4_ = fVar7;
              auVar50._12_4_ = fVar7;
              auVar50._16_4_ = fVar7;
              auVar50._20_4_ = fVar7;
              auVar50._24_4_ = fVar7;
              auVar50._28_4_ = fVar7;
              uVar16 = vcmpps_avx512vl(local_8a0,auVar50,2);
              uVar18 = vcmpps_avx512vl(auVar54,auVar59,4);
              local_900 = (byte)uVar15 & (byte)uVar16 & (byte)uVar18 & local_900;
              if (local_900 == 0) goto LAB_00684f9f;
              local_820 = 0xf0;
              auVar66._8_4_ = 0x219392ef;
              auVar66._0_8_ = 0x219392ef219392ef;
              auVar66._12_4_ = 0x219392ef;
              auVar66._16_4_ = 0x219392ef;
              auVar66._20_4_ = 0x219392ef;
              auVar66._24_4_ = 0x219392ef;
              auVar66._28_4_ = 0x219392ef;
              uVar22 = vcmpps_avx512vl(local_980,auVar66,5);
              auVar58 = vrcp14ps_avx512vl(local_980);
              auVar72._8_4_ = 0x3f800000;
              auVar72._0_8_ = 0x3f8000003f800000;
              auVar72._12_4_ = 0x3f800000;
              auVar72._16_4_ = 0x3f800000;
              auVar72._20_4_ = 0x3f800000;
              auVar72._24_4_ = 0x3f800000;
              auVar72._28_4_ = 0x3f800000;
              auVar30 = vfnmadd213ps_fma(local_980,auVar58,auVar72);
              auVar59 = vfmadd132ps_avx512vl(ZEXT1632(auVar30),auVar58,auVar58);
              fVar7 = (float)((uint)((byte)uVar22 & 1) * auVar59._0_4_);
              fVar1 = (float)((uint)((byte)(uVar22 >> 1) & 1) * auVar59._4_4_);
              fVar2 = (float)((uint)((byte)(uVar22 >> 2) & 1) * auVar59._8_4_);
              fVar3 = (float)((uint)((byte)(uVar22 >> 3) & 1) * auVar59._12_4_);
              fVar4 = (float)((uint)((byte)(uVar22 >> 4) & 1) * auVar59._16_4_);
              fVar5 = (float)((uint)((byte)(uVar22 >> 5) & 1) * auVar59._20_4_);
              fVar6 = (float)((uint)((byte)(uVar22 >> 6) & 1) * auVar59._24_4_);
              auVar53._4_4_ = fVar1 * local_9c0._4_4_;
              auVar53._0_4_ = fVar7 * local_9c0._0_4_;
              auVar53._8_4_ = fVar2 * local_9c0._8_4_;
              auVar53._12_4_ = fVar3 * local_9c0._12_4_;
              auVar53._16_4_ = fVar4 * local_9c0._16_4_;
              auVar53._20_4_ = fVar5 * local_9c0._20_4_;
              auVar53._24_4_ = fVar6 * local_9c0._24_4_;
              auVar53._28_4_ = local_9c0._28_4_;
              auVar59 = vminps_avx(auVar53,auVar72);
              auVar56._4_4_ = local_9a0._4_4_ * fVar1;
              auVar56._0_4_ = local_9a0._0_4_ * fVar7;
              auVar56._8_4_ = local_9a0._8_4_ * fVar2;
              auVar56._12_4_ = local_9a0._12_4_ * fVar3;
              auVar56._16_4_ = local_9a0._16_4_ * fVar4;
              auVar56._20_4_ = local_9a0._20_4_ * fVar5;
              auVar56._24_4_ = local_9a0._24_4_ * fVar6;
              auVar56._28_4_ = auVar58._28_4_;
              auVar58 = vminps_avx(auVar56,auVar72);
              auVar41 = vsubps_avx(auVar72,auVar59);
              auVar54 = vsubps_avx(auVar72,auVar58);
              local_8c0 = vblendps_avx(auVar58,auVar41,0xf0);
              local_8e0 = vblendps_avx(auVar59,auVar54,0xf0);
              local_880._4_4_ = local_960._4_4_ * 1.0;
              local_880._0_4_ = local_960._0_4_ * 1.0;
              local_880._8_4_ = local_960._8_4_ * 1.0;
              local_880._12_4_ = local_960._12_4_ * 1.0;
              local_880._16_4_ = local_960._16_4_ * -1.0;
              local_880._20_4_ = local_960._20_4_ * -1.0;
              local_880._24_4_ = local_960._24_4_ * -1.0;
              local_880._28_4_ = local_960._28_4_;
              local_860._4_4_ = local_940._4_4_ * 1.0;
              local_860._0_4_ = local_940._0_4_ * 1.0;
              local_860._8_4_ = local_940._8_4_ * 1.0;
              local_860._12_4_ = local_940._12_4_ * 1.0;
              local_860._16_4_ = local_940._16_4_ * -1.0;
              local_860._20_4_ = local_940._20_4_ * -1.0;
              local_860._24_4_ = local_940._24_4_ * -1.0;
              local_860._28_4_ = local_940._28_4_;
              local_840._4_4_ = local_920._4_4_ * 1.0;
              local_840._0_4_ = local_920._0_4_ * 1.0;
              local_840._8_4_ = local_920._8_4_ * 1.0;
              local_840._12_4_ = local_920._12_4_ * 1.0;
              local_840._16_4_ = local_920._16_4_ * -1.0;
              local_840._20_4_ = local_920._20_4_ * -1.0;
              local_840._24_4_ = local_920._24_4_ * -1.0;
              local_840._28_4_ = local_920._28_4_;
              local_af8 = (ulong)local_900;
              auVar74 = ZEXT1664(local_b30);
              auVar75 = ZEXT1664(local_b40);
              auVar65 = ZEXT1664(local_b50);
              auVar71 = ZEXT1664(local_b60);
              do {
                local_b68 = 0;
                for (uVar22 = local_af8; (uVar22 & 1) == 0;
                    uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                  local_b68 = local_b68 + 1;
                }
                local_aa8 = *(uint *)((long)&local_9e0 + local_b68 * 4);
                local_b00 = (pSVar9->geometries).items[local_aa8].ptr;
                if ((local_b00->mask & ray->mask) == 0) {
                  local_af8 = local_af8 ^ 1L << (local_b68 & 0x3f);
                }
                else {
                  pRVar25 = local_ad8->args;
                  if ((pRVar25->filter == (RTCFilterFunctionN)0x0) &&
                     (local_b00->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00684ff4:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  local_a60 = auVar83._0_16_;
                  local_a50 = auVar82._0_16_;
                  local_a40 = auVar81._0_16_;
                  local_a30 = auVar80._0_16_;
                  local_a20 = auVar79._0_16_;
                  local_a10 = auVar78._0_16_;
                  uVar22 = (ulong)(uint)((int)local_b68 * 4);
                  local_a90.context = local_ad8->user;
                  local_ac0 = *(undefined4 *)(local_880 + uVar22);
                  local_abc = *(undefined4 *)(local_860 + uVar22);
                  local_ab8 = *(undefined4 *)(local_840 + uVar22);
                  local_ab4 = *(undefined4 *)(local_8e0 + uVar22);
                  local_ab0 = *(undefined4 *)(local_8c0 + uVar22);
                  local_aac = *(undefined4 *)((long)&local_a00 + uVar22);
                  local_aa4 = (local_a90.context)->instID[0];
                  local_aa0 = (local_a90.context)->instPrimID[0];
                  fVar67 = ray->tfar;
                  ray->tfar = *(float *)(local_8a0 + uVar22);
                  local_b6c = -1;
                  local_a90.valid = &local_b6c;
                  local_a90.geometryUserPtr = local_b00->userPtr;
                  local_a90.hit = (RTCHitN *)&local_ac0;
                  local_a90.N = 1;
                  local_a90.ray = (RTCRayN *)ray;
                  if (((local_b00->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                      (local_b08 = pRVar25, (*local_b00->occlusionFilterN)(&local_a90),
                      pRVar25 = local_b08, *local_a90.valid != 0)) &&
                     ((pRVar25->filter == (RTCFilterFunctionN)0x0 ||
                      ((((pRVar25->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((local_b00->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*pRVar25->filter)(&local_a90), *local_a90.valid != 0))))))
                  goto LAB_00684ff4;
                  ray->tfar = fVar67;
                  local_af8 = local_af8 ^ 1L << (local_b68 & 0x3f);
                  auVar78 = ZEXT1664(local_a10);
                  auVar79 = ZEXT1664(local_a20);
                  auVar80 = ZEXT1664(local_a30);
                  auVar81 = ZEXT1664(local_a40);
                  auVar82 = ZEXT1664(local_a50);
                  auVar83 = ZEXT1664(local_a60);
                  auVar74 = ZEXT1664(local_b30);
                  auVar75 = ZEXT1664(local_b40);
                  auVar65 = ZEXT1664(local_b50);
                  auVar71 = ZEXT1664(local_b60);
                  fVar61 = local_b20;
                  fVar67 = fStack_b1c;
                  fVar68 = fStack_b18;
                  fVar69 = fStack_b14;
                }
              } while (local_af8 != 0);
            }
            local_ac8 = local_ac8 + 1;
          } while (local_ac8 != local_ad0);
        }
LAB_00684fe1:
      } while (local_ae0 != &local_800);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }